

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cProgramInterfaceQueryTests.cpp
# Opt level: O0

long __thiscall glcts::anon_unknown_0::AtomicCounterSimple::Run(AtomicCounterSimple *this)

{
  uint uVar1;
  bool bVar2;
  GLuint GVar3;
  mapped_type *pmVar4;
  pair<std::_Rb_tree_const_iterator<unsigned_int>,_bool> pVar5;
  bool local_2a59;
  bool local_29e9;
  _Self local_26d8;
  key_type local_26cc;
  _Self local_26c8;
  int local_26c0;
  allocator<char> local_26b9;
  int i_1;
  _Base_ptr local_2698;
  undefined1 local_2690;
  allocator<char> local_2681;
  key_type local_2680;
  _Base_ptr local_2660;
  undefined1 local_2658;
  allocator<char> local_2649;
  key_type local_2648;
  GLint local_2628 [2];
  GLint param2 [1000];
  undefined1 local_1680 [8];
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> exp2;
  _Self local_1648;
  key_type local_163c;
  _Self local_1638;
  int local_1630;
  allocator<char> local_1629;
  int i;
  _Base_ptr local_1608;
  undefined1 local_1600;
  allocator<char> local_15f1;
  key_type local_15f0;
  _Base_ptr local_15d0;
  undefined1 local_15c8;
  allocator<char> local_15b9;
  key_type local_15b8;
  undefined1 local_1598 [8];
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> exp;
  GLint param [1000];
  GLenum prop2;
  undefined8 local_5a0;
  GLint expected3 [3];
  allocator<char> local_569;
  key_type local_568;
  undefined8 local_548;
  GLint expected2 [3];
  undefined8 local_518;
  GLenum props2 [3];
  undefined4 local_4e8;
  undefined4 local_4e4;
  GLint expected [4];
  allocator<char> local_4c9;
  key_type local_4c8;
  undefined8 uStack_4a8;
  GLenum props [4];
  key_type local_490;
  uint local_46c;
  uint local_468;
  GLint res;
  GLsizei length;
  GLsizei bufSize;
  GLenum prop;
  allocator<char> local_431;
  string local_430 [39];
  allocator<char> local_409;
  string local_408 [39];
  allocator<char> local_3e1;
  string local_3e0 [39];
  allocator<char> local_3b9;
  string local_3b8 [39];
  allocator<char> local_391;
  string local_390 [39];
  allocator<char> local_369;
  string local_368 [39];
  allocator<char> local_341;
  string local_340 [39];
  allocator<char> local_319;
  string local_318 [39];
  allocator<char> local_2f1;
  key_type local_2f0;
  allocator<char> local_2c9;
  string local_2c8 [39];
  allocator<char> local_2a1;
  key_type local_2a0;
  allocator<char> local_279;
  string local_278 [39];
  allocator<char> local_251;
  key_type local_250;
  allocator<char> local_229;
  string local_228 [39];
  allocator<char> local_201;
  key_type local_200;
  allocator<char> local_1d9;
  string local_1d8 [39];
  allocator<char> local_1b1;
  key_type local_1b0;
  allocator<char> local_189;
  string local_188 [39];
  allocator<char> local_161;
  string local_160 [39];
  allocator<char> local_139;
  string local_138 [39];
  allocator<char> local_111;
  string local_110 [39];
  allocator<char> local_e9;
  string local_e8 [32];
  undefined1 local_c8 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  indicesU;
  long error;
  string local_88;
  GLuint local_64;
  char *pcStack_60;
  GLuint program;
  char *glsl_cs;
  allocator<char> local_41;
  string local_40;
  GLint local_1c;
  AtomicCounterSimple *pAStack_18;
  GLint max_buffer_bindings;
  AtomicCounterSimple *this_local;
  
  local_1c = 0;
  pAStack_18 = this;
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_ComputeShaderTest).super_PIQBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8264,&local_1c);
  if (local_1c < 6) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"Test requires at least 6 atomic counter buffer binding points.",
               &local_41);
    deqp::SubcaseBase::OutputNotSupported((SubcaseBase *)this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    this_local = (AtomicCounterSimple *)0x10;
  }
  else {
    pcStack_60 = 
    "layout(local_size_x = 1, local_size_y = 1) in;  \nlayout(std430) buffer Output {                  \n   mediump vec4 data;                           \n} g_out;                                        \nlayout (binding = 1, offset = 0) uniform highp atomic_uint a;    \nlayout (binding = 2, offset = 0) uniform highp atomic_uint b;    \nlayout (binding = 2, offset = 4) uniform highp atomic_uint c;    \nlayout (binding = 5, offset = 0) uniform highp atomic_uint d[3]; \nlayout (binding = 5, offset = 12) uniform highp atomic_uint e;   \nvoid main() {                                                         \n   uint x = atomicCounterIncrement(d[0]) + atomicCounterIncrement(a); \n   uint y = atomicCounterIncrement(d[1]) + atomicCounterIncrement(b); \n   uint z = atomicCounterIncrement(d[2]) + atomicCounterIncrement(c); \n   uint w = atomicCounterIncrement(e);                                \n   g_out.data = vec4(float(x), float(y), float(z), float(w));         \n}"
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,
               "layout(local_size_x = 1, local_size_y = 1) in;  \nlayout(std430) buffer Output {                  \n   mediump vec4 data;                           \n} g_out;                                        \nlayout (binding = 1, offset = 0) uniform highp atomic_uint a;    \nlayout (binding = 2, offset = 0) uniform highp atomic_uint b;    \nlayout (binding = 2, offset = 4) uniform highp atomic_uint c;    \nlayout (binding = 5, offset = 0) uniform highp atomic_uint d[3]; \nlayout (binding = 5, offset = 12) uniform highp atomic_uint e;   \nvoid main() {                                                         \n   uint x = atomicCounterIncrement(d[0]) + atomicCounterIncrement(a); \n   uint y = atomicCounterIncrement(d[1]) + atomicCounterIncrement(b); \n   uint z = atomicCounterIncrement(d[2]) + atomicCounterIncrement(c); \n   uint w = atomicCounterIncrement(e);                                \n   g_out.data = vec4(float(x), float(y), float(z), float(w));         \n}"
               ,(allocator<char> *)((long)&error + 7));
    GVar3 = ComputeShaderTest::CreateComputeProgram(&this->super_ComputeShaderTest,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator((allocator<char> *)((long)&error + 7));
    local_64 = GVar3;
    glu::CallLogWrapper::glLinkProgram
              (&(this->super_ComputeShaderTest).super_PIQBase.super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,GVar3);
    bVar2 = ComputeShaderTest::CheckProgram(&this->super_ComputeShaderTest,local_64,(bool *)0x0);
    if (bVar2) {
      glu::CallLogWrapper::glUseProgram
                (&(this->super_ComputeShaderTest).super_PIQBase.super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,local_64);
      indicesU._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      (*(this->super_ComputeShaderTest).super_PIQBase.super_SubcaseBase.super_GLWrapper.
        _vptr_GLWrapper[0xd])(this,(ulong)local_64,0x92c0,0x92f5,3);
      (*(this->super_ComputeShaderTest).super_PIQBase.super_SubcaseBase.super_GLWrapper.
        _vptr_GLWrapper[0xd])
                (this,(ulong)local_64,0x92c0,0x92f7,2,
                 &indicesU._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)local_c8);
      GVar3 = local_64;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_e8,"a",&local_e9);
      (*(this->super_ComputeShaderTest).super_PIQBase.super_SubcaseBase.super_GLWrapper.
        _vptr_GLWrapper[0xf])
                (this,(ulong)GVar3,0x92e1,local_c8,local_e8,
                 &indicesU._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::__cxx11::string::~string(local_e8);
      std::allocator<char>::~allocator(&local_e9);
      GVar3 = local_64;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_110,"b",&local_111);
      (*(this->super_ComputeShaderTest).super_PIQBase.super_SubcaseBase.super_GLWrapper.
        _vptr_GLWrapper[0xf])
                (this,(ulong)GVar3,0x92e1,local_c8,local_110,
                 &indicesU._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::__cxx11::string::~string(local_110);
      std::allocator<char>::~allocator(&local_111);
      GVar3 = local_64;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_138,"c",&local_139);
      (*(this->super_ComputeShaderTest).super_PIQBase.super_SubcaseBase.super_GLWrapper.
        _vptr_GLWrapper[0xf])
                (this,(ulong)GVar3,0x92e1,local_c8,local_138,
                 &indicesU._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::__cxx11::string::~string(local_138);
      std::allocator<char>::~allocator(&local_139);
      GVar3 = local_64;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_160,"d",&local_161);
      (*(this->super_ComputeShaderTest).super_PIQBase.super_SubcaseBase.super_GLWrapper.
        _vptr_GLWrapper[0xf])
                (this,(ulong)GVar3,0x92e1,local_c8,local_160,
                 &indicesU._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::__cxx11::string::~string(local_160);
      std::allocator<char>::~allocator(&local_161);
      GVar3 = local_64;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_188,"e",&local_189);
      (*(this->super_ComputeShaderTest).super_PIQBase.super_SubcaseBase.super_GLWrapper.
        _vptr_GLWrapper[0xf])
                (this,(ulong)GVar3,0x92e1,local_c8,local_188,
                 &indicesU._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::__cxx11::string::~string(local_188);
      std::allocator<char>::~allocator(&local_189);
      GVar3 = local_64;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b0,"a",&local_1b1);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                             *)local_c8,&local_1b0);
      uVar1 = *pmVar4;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_1d8,"a",&local_1d9);
      (*(this->super_ComputeShaderTest).super_PIQBase.super_SubcaseBase.super_GLWrapper.
        _vptr_GLWrapper[0x10])
                (this,(ulong)GVar3,0x92e1,(ulong)uVar1,local_1d8,
                 &indicesU._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::__cxx11::string::~string(local_1d8);
      std::allocator<char>::~allocator(&local_1d9);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::allocator<char>::~allocator(&local_1b1);
      GVar3 = local_64;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_200,"b",&local_201);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                             *)local_c8,&local_200);
      uVar1 = *pmVar4;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_228,"b",&local_229);
      (*(this->super_ComputeShaderTest).super_PIQBase.super_SubcaseBase.super_GLWrapper.
        _vptr_GLWrapper[0x10])
                (this,(ulong)GVar3,0x92e1,(ulong)uVar1,local_228,
                 &indicesU._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::__cxx11::string::~string(local_228);
      std::allocator<char>::~allocator(&local_229);
      std::__cxx11::string::~string((string *)&local_200);
      std::allocator<char>::~allocator(&local_201);
      GVar3 = local_64;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,"c",&local_251);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                             *)local_c8,&local_250);
      uVar1 = *pmVar4;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_278,"c",&local_279);
      (*(this->super_ComputeShaderTest).super_PIQBase.super_SubcaseBase.super_GLWrapper.
        _vptr_GLWrapper[0x10])
                (this,(ulong)GVar3,0x92e1,(ulong)uVar1,local_278,
                 &indicesU._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::__cxx11::string::~string(local_278);
      std::allocator<char>::~allocator(&local_279);
      std::__cxx11::string::~string((string *)&local_250);
      std::allocator<char>::~allocator(&local_251);
      GVar3 = local_64;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,"d",&local_2a1);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                             *)local_c8,&local_2a0);
      uVar1 = *pmVar4;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_2c8,"d[0]",&local_2c9);
      (*(this->super_ComputeShaderTest).super_PIQBase.super_SubcaseBase.super_GLWrapper.
        _vptr_GLWrapper[0x10])
                (this,(ulong)GVar3,0x92e1,(ulong)uVar1,local_2c8,
                 &indicesU._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::__cxx11::string::~string(local_2c8);
      std::allocator<char>::~allocator(&local_2c9);
      std::__cxx11::string::~string((string *)&local_2a0);
      std::allocator<char>::~allocator(&local_2a1);
      GVar3 = local_64;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f0,"e",&local_2f1);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                             *)local_c8,&local_2f0);
      uVar1 = *pmVar4;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_318,"e",&local_319);
      (*(this->super_ComputeShaderTest).super_PIQBase.super_SubcaseBase.super_GLWrapper.
        _vptr_GLWrapper[0x10])
                (this,(ulong)GVar3,0x92e1,(ulong)uVar1,local_318,
                 &indicesU._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::__cxx11::string::~string(local_318);
      std::allocator<char>::~allocator(&local_319);
      std::__cxx11::string::~string((string *)&local_2f0);
      std::allocator<char>::~allocator(&local_2f1);
      GVar3 = local_64;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_340,"a",&local_341);
      (*(this->super_ComputeShaderTest).super_PIQBase.super_SubcaseBase.super_GLWrapper.
        _vptr_GLWrapper[0x11])
                (this,(ulong)GVar3,0x92e1,local_340,0xffffffff,
                 &indicesU._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::__cxx11::string::~string(local_340);
      std::allocator<char>::~allocator(&local_341);
      GVar3 = local_64;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_368,"b",&local_369);
      (*(this->super_ComputeShaderTest).super_PIQBase.super_SubcaseBase.super_GLWrapper.
        _vptr_GLWrapper[0x11])
                (this,(ulong)GVar3,0x92e1,local_368,0xffffffff,
                 &indicesU._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::__cxx11::string::~string(local_368);
      std::allocator<char>::~allocator(&local_369);
      GVar3 = local_64;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_390,"c",&local_391);
      (*(this->super_ComputeShaderTest).super_PIQBase.super_SubcaseBase.super_GLWrapper.
        _vptr_GLWrapper[0x11])
                (this,(ulong)GVar3,0x92e1,local_390,0xffffffff,
                 &indicesU._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::__cxx11::string::~string(local_390);
      std::allocator<char>::~allocator(&local_391);
      GVar3 = local_64;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_3b8,"d",&local_3b9);
      (*(this->super_ComputeShaderTest).super_PIQBase.super_SubcaseBase.super_GLWrapper.
        _vptr_GLWrapper[0x11])
                (this,(ulong)GVar3,0x92e1,local_3b8,0xffffffff,
                 &indicesU._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::__cxx11::string::~string(local_3b8);
      std::allocator<char>::~allocator(&local_3b9);
      GVar3 = local_64;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_3e0,"e",&local_3e1);
      (*(this->super_ComputeShaderTest).super_PIQBase.super_SubcaseBase.super_GLWrapper.
        _vptr_GLWrapper[0x11])
                (this,(ulong)GVar3,0x92e1,local_3e0,0xffffffff,
                 &indicesU._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::__cxx11::string::~string(local_3e0);
      std::allocator<char>::~allocator(&local_3e1);
      GVar3 = local_64;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_408,"d[0]",&local_409);
      (*(this->super_ComputeShaderTest).super_PIQBase.super_SubcaseBase.super_GLWrapper.
        _vptr_GLWrapper[0x11])
                (this,(ulong)GVar3,0x92e1,local_408,0xffffffff,
                 &indicesU._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::__cxx11::string::~string(local_408);
      std::allocator<char>::~allocator(&local_409);
      GVar3 = local_64;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_430,"d[1]",&local_431);
      (*(this->super_ComputeShaderTest).super_PIQBase.super_SubcaseBase.super_GLWrapper.
        _vptr_GLWrapper[0x11])
                (this,(ulong)GVar3,0x92e1,local_430,0xffffffff,
                 &indicesU._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::__cxx11::string::~string(local_430);
      std::allocator<char>::~allocator(&local_431);
      GVar3 = local_64;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&prop,"d[2]",(allocator<char> *)((long)&bufSize + 3));
      (*(this->super_ComputeShaderTest).super_PIQBase.super_SubcaseBase.super_GLWrapper.
        _vptr_GLWrapper[0x11])
                (this,(ulong)GVar3,0x92e1,&prop,0xffffffff,
                 &indicesU._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::__cxx11::string::~string((string *)&prop);
      std::allocator<char>::~allocator((allocator<char> *)((long)&bufSize + 3));
      GVar3 = local_64;
      length = 0x9301;
      res = 1000;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_490,"a",(allocator<char> *)((long)props + 0xf));
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                             *)local_c8,&local_490);
      glu::CallLogWrapper::glGetProgramResourceiv
                (&(this->super_ComputeShaderTest).super_PIQBase.super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,GVar3,0x92e1,*pmVar4,1,(GLenum *)&length,1000,
                 (GLsizei *)&local_468,(GLint *)&local_46c);
      std::__cxx11::string::~string((string *)&local_490);
      std::allocator<char>::~allocator((allocator<char> *)((long)props + 0xf));
      GVar3 = local_64;
      uStack_4a8 = 0x930300009302;
      props[0] = 0x9304;
      props[1] = 0x9305;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_4c8,"a",&local_4c9);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                             *)local_c8,&local_4c8);
      glu::CallLogWrapper::glGetProgramResourceiv
                (&(this->super_ComputeShaderTest).super_PIQBase.super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,GVar3,0x92e1,*pmVar4,1,(GLenum *)&length,1000,
                 (GLsizei *)&local_468,(GLint *)&local_46c);
      std::__cxx11::string::~string((string *)&local_4c8);
      std::allocator<char>::~allocator(&local_4c9);
      local_4e8 = 1;
      local_4e4 = 4;
      expected[0] = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(props2 + 2),"a",(allocator<char> *)((long)props2 + 7));
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                             *)local_c8,(key_type *)(props2 + 2));
      expected[1] = *pmVar4;
      std::__cxx11::string::~string((string *)(props2 + 2));
      std::allocator<char>::~allocator((allocator<char> *)((long)props2 + 7));
      (*(this->super_ComputeShaderTest).super_PIQBase.super_SubcaseBase.super_GLWrapper.
        _vptr_GLWrapper[0x13])
                (this,(ulong)local_64,0x92c0,(ulong)local_46c,4,&uStack_4a8,4,&local_4e8,
                 &indicesU._M_t._M_impl.super__Rb_tree_header._M_node_count);
      GVar3 = local_64;
      local_518 = 0x930300009302;
      props2[0] = 0x9304;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(expected2 + 2),"b",(allocator<char> *)((long)expected2 + 7));
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                             *)local_c8,(key_type *)(expected2 + 2));
      glu::CallLogWrapper::glGetProgramResourceiv
                (&(this->super_ComputeShaderTest).super_PIQBase.super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,GVar3,0x92e1,*pmVar4,1,(GLenum *)&length,1000,
                 (GLsizei *)&local_468,(GLint *)&local_46c);
      std::__cxx11::string::~string((string *)(expected2 + 2));
      std::allocator<char>::~allocator((allocator<char> *)((long)expected2 + 7));
      local_548 = 0x800000002;
      expected2[0] = 2;
      (*(this->super_ComputeShaderTest).super_PIQBase.super_SubcaseBase.super_GLWrapper.
        _vptr_GLWrapper[0x13])
                (this,(ulong)local_64,0x92c0,(ulong)local_46c,3,&local_518,3,&local_548,
                 &indicesU._M_t._M_impl.super__Rb_tree_header._M_node_count);
      GVar3 = local_64;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_568,"c",&local_569);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                             *)local_c8,&local_568);
      glu::CallLogWrapper::glGetProgramResourceiv
                (&(this->super_ComputeShaderTest).super_PIQBase.super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,GVar3,0x92e1,*pmVar4,1,(GLenum *)&length,1000,
                 (GLsizei *)&local_468,(GLint *)&local_46c);
      std::__cxx11::string::~string((string *)&local_568);
      std::allocator<char>::~allocator(&local_569);
      (*(this->super_ComputeShaderTest).super_PIQBase.super_SubcaseBase.super_GLWrapper.
        _vptr_GLWrapper[0x13])
                (this,(ulong)local_64,0x92c0,(ulong)local_46c,3,&local_518,3,&local_548,
                 &indicesU._M_t._M_impl.super__Rb_tree_header._M_node_count);
      GVar3 = local_64;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(expected3 + 2),"d",(allocator<char> *)((long)expected3 + 7));
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                             *)local_c8,(key_type *)(expected3 + 2));
      glu::CallLogWrapper::glGetProgramResourceiv
                (&(this->super_ComputeShaderTest).super_PIQBase.super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,GVar3,0x92e1,*pmVar4,1,(GLenum *)&length,1000,
                 (GLsizei *)&local_468,(GLint *)&local_46c);
      std::__cxx11::string::~string((string *)(expected3 + 2));
      std::allocator<char>::~allocator((allocator<char> *)((long)expected3 + 7));
      local_5a0 = 0x1000000005;
      expected3[0] = 2;
      (*(this->super_ComputeShaderTest).super_PIQBase.super_SubcaseBase.super_GLWrapper.
        _vptr_GLWrapper[0x13])
                (this,(ulong)local_64,0x92c0,(ulong)local_46c,3,&local_518,3,&local_5a0,
                 &indicesU._M_t._M_impl.super__Rb_tree_header._M_node_count);
      GVar3 = local_64;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&prop2,"e",(allocator<char> *)((long)param + 3999));
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                             *)local_c8,(key_type *)&prop2);
      glu::CallLogWrapper::glGetProgramResourceiv
                (&(this->super_ComputeShaderTest).super_PIQBase.super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,GVar3,0x92e1,*pmVar4,1,(GLenum *)&length,1000,
                 (GLsizei *)&local_468,(GLint *)&local_46c);
      std::__cxx11::string::~string((string *)&prop2);
      std::allocator<char>::~allocator((allocator<char> *)((long)param + 3999));
      (*(this->super_ComputeShaderTest).super_PIQBase.super_SubcaseBase.super_GLWrapper.
        _vptr_GLWrapper[0x13])
                (this,(ulong)local_64,0x92c0,(ulong)local_46c,3,&local_518,3,&local_5a0,
                 &indicesU._M_t._M_impl.super__Rb_tree_header._M_node_count);
      param[0x3e6] = 0x9305;
      std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
                ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                 local_1598);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_15b8,"b",&local_15b9);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                             *)local_c8,&local_15b8);
      pVar5 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
                        ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)local_1598,pmVar4);
      local_15d0 = (_Base_ptr)pVar5.first._M_node;
      local_15c8 = pVar5.second;
      std::__cxx11::string::~string((string *)&local_15b8);
      std::allocator<char>::~allocator(&local_15b9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_15f0,"c",&local_15f1);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                             *)local_c8,&local_15f0);
      pVar5 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
                        ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)local_1598,pmVar4);
      local_1608 = (_Base_ptr)pVar5.first._M_node;
      local_1600 = pVar5.second;
      std::__cxx11::string::~string((string *)&local_15f0);
      std::allocator<char>::~allocator(&local_15f1);
      GVar3 = local_64;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&i,"b",&local_1629);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                             *)local_c8,(key_type *)&i);
      glu::CallLogWrapper::glGetProgramResourceiv
                (&(this->super_ComputeShaderTest).super_PIQBase.super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,GVar3,0x92e1,*pmVar4,1,(GLenum *)&length,1000,
                 (GLsizei *)&local_468,(GLint *)&local_46c);
      std::__cxx11::string::~string((string *)&i);
      std::allocator<char>::~allocator(&local_1629);
      glu::CallLogWrapper::glGetProgramResourceiv
                (&(this->super_ComputeShaderTest).super_PIQBase.super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,local_64,0x92c0,local_46c,1,(GLenum *)(param + 0x3e6),1000,
                 (GLsizei *)&local_468,
                 (GLint *)&exp._M_t._M_impl.super__Rb_tree_header._M_node_count);
      for (local_1630 = 0; local_1630 < (int)local_468; local_1630 = local_1630 + 1) {
        local_163c = param[(long)local_1630 + -2];
        local_1638._M_node =
             (_Base_ptr)
             std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::find
                       ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *
                        )local_1598,&local_163c);
        local_1648._M_node =
             (_Base_ptr)
             std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                       ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *
                        )local_1598);
        local_29e9 = std::operator==(&local_1638,&local_1648);
        local_29e9 = local_29e9 || local_468 != 2;
        if (local_29e9) {
          anon_unknown_0::Output("Length: %d\n",(ulong)local_468);
          anon_unknown_0::Output
                    ("Unexpected index/length found in active variables of ATOMIC_COUNTER_BUFFER: %d\n"
                     ,(ulong)(uint)param[(long)local_1630 + -2]);
          glu::CallLogWrapper::glDeleteProgram
                    (&(this->super_ComputeShaderTest).super_PIQBase.super_SubcaseBase.
                      super_GLWrapper.super_CallLogWrapper,local_64);
          this_local = (AtomicCounterSimple *)&DAT_ffffffffffffffff;
          exp2._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 1;
          goto LAB_0144fb4b;
        }
      }
      std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
                ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                 local_1680);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2648,"d",&local_2649);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                             *)local_c8,&local_2648);
      pVar5 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
                        ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)local_1680,pmVar4);
      local_2660 = (_Base_ptr)pVar5.first._M_node;
      local_2658 = pVar5.second;
      std::__cxx11::string::~string((string *)&local_2648);
      std::allocator<char>::~allocator(&local_2649);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2680,"e",&local_2681);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                             *)local_c8,&local_2680);
      pVar5 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
                        ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)local_1680,pmVar4);
      local_2698 = (_Base_ptr)pVar5.first._M_node;
      local_2690 = pVar5.second;
      std::__cxx11::string::~string((string *)&local_2680);
      std::allocator<char>::~allocator(&local_2681);
      GVar3 = local_64;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&i_1,"d",&local_26b9);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                             *)local_c8,(key_type *)&i_1);
      glu::CallLogWrapper::glGetProgramResourceiv
                (&(this->super_ComputeShaderTest).super_PIQBase.super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,GVar3,0x92e1,*pmVar4,1,(GLenum *)&length,1000,
                 (GLsizei *)&local_468,(GLint *)&local_46c);
      std::__cxx11::string::~string((string *)&i_1);
      std::allocator<char>::~allocator(&local_26b9);
      glu::CallLogWrapper::glGetProgramResourceiv
                (&(this->super_ComputeShaderTest).super_PIQBase.super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,local_64,0x92c0,local_46c,1,(GLenum *)(param + 0x3e6),1000,
                 (GLsizei *)&local_468,local_2628);
      for (local_26c0 = 0; local_26c0 < (int)local_468; local_26c0 = local_26c0 + 1) {
        local_26cc = param2[(long)local_26c0 + -2];
        local_26c8._M_node =
             (_Base_ptr)
             std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::find
                       ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *
                        )local_1680,&local_26cc);
        local_26d8._M_node =
             (_Base_ptr)
             std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                       ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *
                        )local_1680);
        local_2a59 = std::operator==(&local_26c8,&local_26d8);
        local_2a59 = local_2a59 || local_468 != 2;
        if (local_2a59) {
          anon_unknown_0::Output("Length: %d\n",(ulong)local_468);
          anon_unknown_0::Output
                    ("Unexpected index/length found in active variables of ATOMIC_COUNTER_BUFFER: %d\n"
                     ,(ulong)(uint)param2[(long)local_26c0 + -2]);
          glu::CallLogWrapper::glDeleteProgram
                    (&(this->super_ComputeShaderTest).super_PIQBase.super_SubcaseBase.
                      super_GLWrapper.super_CallLogWrapper,local_64);
          this_local = (AtomicCounterSimple *)&DAT_ffffffffffffffff;
          goto LAB_0144fb2f;
        }
      }
      glu::CallLogWrapper::glDeleteProgram
                (&(this->super_ComputeShaderTest).super_PIQBase.super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,local_64);
      this_local = (AtomicCounterSimple *)indicesU._M_t._M_impl.super__Rb_tree_header._M_node_count;
LAB_0144fb2f:
      exp2._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 1;
      std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
                ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                 local_1680);
LAB_0144fb4b:
      std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
                ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                 local_1598);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
              *)local_c8);
    }
    else {
      glu::CallLogWrapper::glDeleteProgram
                (&(this->super_ComputeShaderTest).super_PIQBase.super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,local_64);
      this_local = (AtomicCounterSimple *)&DAT_ffffffffffffffff;
    }
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{

		GLint max_buffer_bindings = 0;
		glGetIntegerv(GL_MAX_COMPUTE_ATOMIC_COUNTER_BUFFERS, &max_buffer_bindings);
		if (max_buffer_bindings < 6)
		{
			OutputNotSupported("Test requires at least 6 atomic counter buffer binding points.");
			return NOT_SUPPORTED;
		}

		const char* const glsl_cs = "layout(local_size_x = 1, local_size_y = 1) in;  \n"
									"layout(std430) buffer Output {                  \n"
									"   mediump vec4 data;                           \n"
									"} g_out;                                        \n"
									""
									"layout (binding = 1, offset = 0) uniform highp atomic_uint a;    \n"
									"layout (binding = 2, offset = 0) uniform highp atomic_uint b;    \n"
									"layout (binding = 2, offset = 4) uniform highp atomic_uint c;    \n"
									"layout (binding = 5, offset = 0) uniform highp atomic_uint d[3]; \n"
									"layout (binding = 5, offset = 12) uniform highp atomic_uint e;   \n"
									""
									"void main() {                                                         \n"
									"   uint x = atomicCounterIncrement(d[0]) + atomicCounterIncrement(a); \n"
									"   uint y = atomicCounterIncrement(d[1]) + atomicCounterIncrement(b); \n"
									"   uint z = atomicCounterIncrement(d[2]) + atomicCounterIncrement(c); \n"
									"   uint w = atomicCounterIncrement(e);                                \n"
									"   g_out.data = vec4(float(x), float(y), float(z), float(w));         \n"
									"}";

		GLuint program = CreateComputeProgram(glsl_cs);
		glLinkProgram(program);
		if (!CheckProgram(program))
		{
			glDeleteProgram(program);
			return ERROR;
		}
		glUseProgram(program);

		long error = NO_ERROR;

		VerifyGetProgramInterfaceiv(program, GL_ATOMIC_COUNTER_BUFFER, GL_ACTIVE_RESOURCES, 3, error);
		VerifyGetProgramInterfaceiv(program, GL_ATOMIC_COUNTER_BUFFER, GL_MAX_NUM_ACTIVE_VARIABLES, 2, error);

		std::map<std::string, GLuint> indicesU;
		VerifyGetProgramResourceIndex(program, GL_UNIFORM, indicesU, "a", error);
		VerifyGetProgramResourceIndex(program, GL_UNIFORM, indicesU, "b", error);
		VerifyGetProgramResourceIndex(program, GL_UNIFORM, indicesU, "c", error);
		VerifyGetProgramResourceIndex(program, GL_UNIFORM, indicesU, "d", error);
		VerifyGetProgramResourceIndex(program, GL_UNIFORM, indicesU, "e", error);

		VerifyGetProgramResourceName(program, GL_UNIFORM, indicesU["a"], "a", error);
		VerifyGetProgramResourceName(program, GL_UNIFORM, indicesU["b"], "b", error);
		VerifyGetProgramResourceName(program, GL_UNIFORM, indicesU["c"], "c", error);
		VerifyGetProgramResourceName(program, GL_UNIFORM, indicesU["d"], "d[0]", error);
		VerifyGetProgramResourceName(program, GL_UNIFORM, indicesU["e"], "e", error);

		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "a", -1, error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "b", -1, error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "c", -1, error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "d", -1, error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "e", -1, error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "d[0]", -1, error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "d[1]", -1, error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "d[2]", -1, error);

		GLenum		  prop	= GL_ATOMIC_COUNTER_BUFFER_INDEX;
		const GLsizei bufSize = 1000;
		GLsizei		  length;
		GLint		  res;
		glGetProgramResourceiv(program, GL_UNIFORM, indicesU["a"], 1, &prop, bufSize, &length, &res);

		GLenum props[] = { GL_BUFFER_BINDING, GL_BUFFER_DATA_SIZE, GL_NUM_ACTIVE_VARIABLES, GL_ACTIVE_VARIABLES };
		glGetProgramResourceiv(program, GL_UNIFORM, indicesU["a"], 1, &prop, bufSize, &length, &res);
		GLint expected[] = { 1, 4, 1, static_cast<GLint>(indicesU["a"]) };
		VerifyGetProgramResourceiv(program, GL_ATOMIC_COUNTER_BUFFER, res, 4, props, 4, expected, error);

		GLenum props2[] = { GL_BUFFER_BINDING, GL_BUFFER_DATA_SIZE, GL_NUM_ACTIVE_VARIABLES };
		glGetProgramResourceiv(program, GL_UNIFORM, indicesU["b"], 1, &prop, bufSize, &length, &res);
		GLint expected2[] = { 2, 8, 2 };
		VerifyGetProgramResourceiv(program, GL_ATOMIC_COUNTER_BUFFER, res, 3, props2, 3, expected2, error);
		glGetProgramResourceiv(program, GL_UNIFORM, indicesU["c"], 1, &prop, bufSize, &length, &res);
		VerifyGetProgramResourceiv(program, GL_ATOMIC_COUNTER_BUFFER, res, 3, props2, 3, expected2, error);

		glGetProgramResourceiv(program, GL_UNIFORM, indicesU["d"], 1, &prop, bufSize, &length, &res);
		GLint expected3[] = { 5, 16, 2 };
		VerifyGetProgramResourceiv(program, GL_ATOMIC_COUNTER_BUFFER, res, 3, props2, 3, expected3, error);
		glGetProgramResourceiv(program, GL_UNIFORM, indicesU["e"], 1, &prop, bufSize, &length, &res);
		VerifyGetProgramResourceiv(program, GL_ATOMIC_COUNTER_BUFFER, res, 3, props2, 3, expected3, error);

		GLenum			 prop2 = GL_ACTIVE_VARIABLES;
		GLint			 param[bufSize];
		std::set<GLuint> exp;
		exp.insert(indicesU["b"]);
		exp.insert(indicesU["c"]);
		glGetProgramResourceiv(program, GL_UNIFORM, indicesU["b"], 1, &prop, bufSize, &length, &res);
		glGetProgramResourceiv(program, GL_ATOMIC_COUNTER_BUFFER, res, 1, &prop2, bufSize, &length, param);
		for (int i = 0; i < length; ++i)
		{
			if (exp.find(param[i]) == exp.end() || length != 2)
			{
				Output("Length: %d\n", length);
				Output("Unexpected index/length found in active variables of ATOMIC_COUNTER_BUFFER: %d\n", param[i]);
				glDeleteProgram(program);
				return ERROR;
			}
		}
		std::set<GLuint> exp2;
		GLint			 param2[bufSize];
		exp2.insert(indicesU["d"]);
		exp2.insert(indicesU["e"]);
		glGetProgramResourceiv(program, GL_UNIFORM, indicesU["d"], 1, &prop, bufSize, &length, &res);
		glGetProgramResourceiv(program, GL_ATOMIC_COUNTER_BUFFER, res, 1, &prop2, bufSize, &length, param2);
		for (int i = 0; i < length; ++i)
		{
			if (exp2.find(param2[i]) == exp2.end() || length != 2)
			{
				Output("Length: %d\n", length);
				Output("Unexpected index/length found in active variables of ATOMIC_COUNTER_BUFFER: %d\n", param2[i]);
				glDeleteProgram(program);
				return ERROR;
			}
		}

		glDeleteProgram(program);
		return error;
	}